

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_NodeStoreEntry ** findSlot(UA_NodeStore *ns,UA_NodeId *nodeid)

{
  uint uVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_NodeStoreEntry *pUVar3;
  bool bVar4;
  UA_Boolean UVar5;
  UA_UInt32 UVar6;
  uint uVar7;
  UA_NodeStoreEntry **unaff_RBX;
  UA_NodeStoreEntry **ppUVar8;
  uint uVar9;
  ulong uVar10;
  
  UVar6 = UA_NodeId_hash(nodeid);
  uVar1 = ns->size;
  uVar10 = (ulong)UVar6 % (ulong)uVar1;
  ppUVar2 = ns->entries;
  do {
    ppUVar8 = ppUVar2 + uVar10;
    pUVar3 = *ppUVar8;
    if ((UA_NodeStoreEntry *)0x1 < pUVar3) {
      UVar5 = UA_NodeId_equal(&(pUVar3->node).nodeId,nodeid);
      if (UVar5) {
        ppUVar8 = (UA_NodeStoreEntry **)0x0;
      }
      if ((UA_NodeStoreEntry *)0x1 >= pUVar3 || UVar5) goto LAB_0011d9e2;
      uVar9 = (int)uVar10 + UVar6 % (uVar1 - 2) + 1;
      uVar7 = uVar1;
      if (uVar9 < uVar1) {
        uVar7 = 0;
      }
      uVar10 = (ulong)(uVar9 - uVar7);
      bVar4 = true;
    }
    else {
LAB_0011d9e2:
      unaff_RBX = ppUVar8;
      bVar4 = false;
    }
    if (!bVar4) {
      return unaff_RBX;
    }
  } while( true );
}

Assistant:

static UA_NodeStoreEntry **
findSlot(const UA_NodeStore *ns, const UA_NodeId *nodeid) {
    UA_UInt32 h = UA_NodeId_hash(nodeid);
    UA_UInt32 size = ns->size;
    UA_UInt32 idx = mod(h, size);
    UA_UInt32 hash2 = mod2(h, size);

    while(true) {
        UA_NodeStoreEntry *e = ns->entries[idx];
        if(e > UA_NODESTORE_TOMBSTONE &&
           UA_NodeId_equal(&e->node.nodeId, nodeid))
            return NULL;
        if(ns->entries[idx] <= UA_NODESTORE_TOMBSTONE)
            return &ns->entries[idx];
        idx += hash2;
        if(idx >= size)
            idx -= size;
    }

    /* NOTREACHED */
    return NULL;
}